

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_DCT.cc
# Opt level: O2

void __thiscall Pl_DCT::compress(Pl_DCT *this,void *cinfo_p,Buffer *b)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_> tVar4;
  Members *pMVar5;
  CompressConfig *pCVar6;
  JDIMENSION JVar7;
  J_COLOR_SPACE JVar8;
  uint uVar9;
  __uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> __s;
  tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_> *ptVar10;
  unsigned_long uVar11;
  size_t sVar12;
  uchar *puVar13;
  runtime_error *this_00;
  __array outbuffer_ph;
  JSAMPROW row_pointer [1];
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  jpeg_CreateCompress(cinfo_p,0x50,0x248);
  __s._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_>)operator_new__(0x10000);
  memset((void *)__s._M_t.
                 super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                 super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,0,0x10000);
  tVar4.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>)
       (this->super_Pipeline).next_;
  outbuffer_ph._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t
  .super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
       (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
       __s._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
       super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  ptVar10 = (tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_> *)
            (*(code *)**(undefined8 **)((long)cinfo_p + 8))(cinfo_p,0,0x40);
  *(tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_> **)((long)cinfo_p + 0x28) =
       ptVar10;
  ptVar10[2].super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_> =
       (_Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>)
       init_pipeline_destination;
  ptVar10[3].super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_> =
       (_Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>)
       empty_pipeline_output_buffer;
  ptVar10[4].super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_> =
       (_Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>)
       term_pipeline_destination;
  ((__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> *)(ptVar10 + 5))->_M_t =
       __s._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
       super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  ptVar10->super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_> =
       (_Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>)
       __s._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
       super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  ptVar10[6].super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false> = (uchar *)0x10000;
  ptVar10[1].super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false> = (uchar *)0x10000;
  ptVar10[7].super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false> =
       (_Head_base<0UL,_unsigned_char_*,_false>)
       tVar4.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
       super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  pMVar5 = (this->m)._M_t.
           super___uniq_ptr_impl<Pl_DCT::Members,_std::default_delete<Pl_DCT::Members>_>._M_t.
           super__Tuple_impl<0UL,_Pl_DCT::Members_*,_std::default_delete<Pl_DCT::Members>_>.
           super__Head_base<0UL,_Pl_DCT::Members_*,_false>._M_head_impl;
  JVar7 = pMVar5->image_height;
  iVar1 = pMVar5->components;
  JVar8 = pMVar5->color_space;
  *(JDIMENSION *)((long)cinfo_p + 0x30) = pMVar5->image_width;
  *(JDIMENSION *)((long)cinfo_p + 0x34) = JVar7;
  *(int *)((long)cinfo_p + 0x38) = iVar1;
  *(J_COLOR_SPACE *)((long)cinfo_p + 0x3c) = JVar8;
  jpeg_set_defaults(cinfo_p);
  pCVar6 = ((this->m)._M_t.
            super___uniq_ptr_impl<Pl_DCT::Members,_std::default_delete<Pl_DCT::Members>_>._M_t.
            super__Tuple_impl<0UL,_Pl_DCT::Members_*,_std::default_delete<Pl_DCT::Members>_>.
            super__Head_base<0UL,_Pl_DCT::Members_*,_false>._M_head_impl)->config_callback;
  if (pCVar6 != (CompressConfig *)0x0) {
    (*pCVar6->_vptr_CompressConfig[2])(pCVar6,cinfo_p);
  }
  jpeg_start_compress(cinfo_p,1);
  iVar1 = *(int *)((long)cinfo_p + 0x30);
  uVar9 = QIntC::IntConverter<int,_unsigned_int,_true,_false>::convert
                    ((int *)((long)cinfo_p + 0x38));
  uVar2 = *(uint *)((long)cinfo_p + 0x30);
  uVar3 = *(uint *)((long)cinfo_p + 0x34);
  uVar11 = QIntC::IntConverter<int,_unsigned_long,_true,_false>::convert
                     ((int *)((long)cinfo_p + 0x38));
  sVar12 = Buffer::getSize(b);
  uVar11 = (ulong)uVar2 * (ulong)uVar3 * uVar11;
  if (sVar12 == uVar11) {
    puVar13 = Buffer::getBuffer(b);
    while (*(uint *)((long)cinfo_p + 0x154) < *(uint *)((long)cinfo_p + 0x34)) {
      row_pointer[0] = puVar13 + *(uint *)((long)cinfo_p + 0x154) * uVar9 * iVar1;
      jpeg_write_scanlines(cinfo_p,row_pointer,1);
    }
    jpeg_finish_compress(cinfo_p);
    (*((this->super_Pipeline).next_)->_vptr_Pipeline[3])();
    std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
              (&outbuffer_ph);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  sVar12 = Buffer::getSize(b);
  std::__cxx11::to_string(&local_90,sVar12);
  std::operator+(&local_70,"Pl_DCT: image buffer size = ",&local_90);
  std::operator+(&local_50,&local_70,"; expected size = ");
  std::__cxx11::to_string(&local_b0,uVar11);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)row_pointer,
                 &local_50,&local_b0);
  std::runtime_error::runtime_error(this_00,(string *)row_pointer);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
Pl_DCT::compress(void* cinfo_p, Buffer* b)
{
    auto* cinfo = reinterpret_cast<jpeg_compress_struct*>(cinfo_p);

#if ((defined(__GNUC__) && ((__GNUC__ * 100) + __GNUC_MINOR__) >= 406) || defined(__clang__))
# pragma GCC diagnostic push
# pragma GCC diagnostic ignored "-Wold-style-cast"
#endif
    jpeg_create_compress(cinfo);
#if ((defined(__GNUC__) && ((__GNUC__ * 100) + __GNUC_MINOR__) >= 406) || defined(__clang__))
# pragma GCC diagnostic pop
#endif
    static int const BUF_SIZE = 65536;
    auto outbuffer_ph = std::make_unique<unsigned char[]>(BUF_SIZE);
    unsigned char* outbuffer = outbuffer_ph.get();
    jpeg_pipeline_dest(cinfo, outbuffer, BUF_SIZE, next());

    cinfo->image_width = m->image_width;
    cinfo->image_height = m->image_height;
    cinfo->input_components = m->components;
    cinfo->in_color_space = m->color_space;
    jpeg_set_defaults(cinfo);
    if (m->config_callback) {
        m->config_callback->apply(cinfo);
    }

    jpeg_start_compress(cinfo, TRUE);

    unsigned int width = cinfo->image_width * QIntC::to_uint(cinfo->input_components);
    size_t expected_size = QIntC::to_size(cinfo->image_height) *
        QIntC::to_size(cinfo->image_width) * QIntC::to_size(cinfo->input_components);
    if (b->getSize() != expected_size) {
        throw std::runtime_error(
            "Pl_DCT: image buffer size = " + std::to_string(b->getSize()) +
            "; expected size = " + std::to_string(expected_size));
    }
    JSAMPROW row_pointer[1];
    unsigned char* buffer = b->getBuffer();
    while (cinfo->next_scanline < cinfo->image_height) {
        // We already verified that the buffer is big enough.
        row_pointer[0] = &buffer[cinfo->next_scanline * width];
        (void)jpeg_write_scanlines(cinfo, row_pointer, 1);
    }
    jpeg_finish_compress(cinfo);
    next()->finish();
}